

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O1

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
               (int *args,int *args_1,short *args_2)

{
  pointer *pppDVar1;
  iterator __position;
  DrawerCommandQueue *this;
  DrawFogBoundaryLinePalCommand *this_00;
  DrawFogBoundaryLinePalCommand command;
  DrawFogBoundaryLinePalCommand local_a8;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              (&local_a8,*args,*args_1,(int)*args_2);
    VectoredTryCatch(&local_a8,
                     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,_int_&,_const_int_&,_short_&>
                     ::anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,_int_&,_const_int_&,_short_&>
                     ::anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
    if (this_00 == (DrawFogBoundaryLinePalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
      if (this_00 == (DrawFogBoundaryLinePalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              (this_00,*args,*args_1,(int)*args_2);
    __position._M_current =
         (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_a8.super_PalSpanCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
      std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::_M_realloc_insert<DrawerCommand*>
                ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,__position
                 ,(DrawerCommand **)&local_a8);
    }
    else {
      *__position._M_current = (DrawerCommand *)this_00;
      pppDVar1 = &(this->commands).
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}